

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O0

bool units::hasValidNumericalWordStart(string *ustring)

{
  int iVar1;
  size_type sVar2;
  allocator<char> *unaff_retaddr;
  char *in_stack_00000008;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_00000010;
  uint7 in_stack_ffffffffffffffc8;
  char in_stack_ffffffffffffffcf;
  char __c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffd0;
  undefined1 local_1d [29];
  
  if (hasValidNumericalWordStart(std::__cxx11::string_const&)::first_letters_abi_cxx11_ == '\0') {
    iVar1 = __cxa_guard_acquire(&hasValidNumericalWordStart(std::__cxx11::string_const&)::
                                 first_letters_abi_cxx11_);
    if (iVar1 != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_00000010,in_stack_00000008,unaff_retaddr);
      std::allocator<char>::~allocator((allocator<char> *)(local_1d + 0x14));
      __cxa_atexit(std::__cxx11::string::~string,
                   &hasValidNumericalWordStart(std::__cxx11::string_const&)::
                    first_letters_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&hasValidNumericalWordStart(std::__cxx11::string_const&)::
                           first_letters_abi_cxx11_);
    }
  }
  if (hasValidNumericalWordStart(std::__cxx11::string_const&)::second_letters_abi_cxx11_ == '\0') {
    iVar1 = __cxa_guard_acquire(&hasValidNumericalWordStart(std::__cxx11::string_const&)::
                                 second_letters_abi_cxx11_);
    if (iVar1 != 0) {
      in_stack_ffffffffffffffd0 =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1d;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_00000010,in_stack_00000008,unaff_retaddr);
      std::allocator<char>::~allocator((allocator<char> *)local_1d);
      __cxa_atexit(std::__cxx11::string::~string,
                   &hasValidNumericalWordStart(std::__cxx11::string_const&)::
                    second_letters_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&hasValidNumericalWordStart(std::__cxx11::string_const&)::
                           second_letters_abi_cxx11_);
    }
  }
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator[]
            (in_stack_ffffffffffffffd0,CONCAT17(in_stack_ffffffffffffffcf,in_stack_ffffffffffffffc8)
            );
  sVar2 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          find_first_of(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcf,0x6ca960);
  __c = false;
  if (sVar2 != 0xffffffffffffffff) {
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator[]
              (in_stack_ffffffffffffffd0,(ulong)in_stack_ffffffffffffffc8);
    sVar2 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            find_first_of(in_stack_ffffffffffffffd0,__c,0x6ca991);
    __c = sVar2 != 0xffffffffffffffff;
  }
  return (bool)__c;
}

Assistant:

static bool hasValidNumericalWordStart(const std::string& ustring)
{  // do a check if the first and second letters make sense
    static const std::string first_letters = "otfsenhmbtzaOTFSENHMBTZA";
    static const std::string second_letters = "nwhoielurNWHOIELUR";
    return (
        first_letters.find_first_of(ustring[0]) != std::string::npos &&
        second_letters.find_first_of(ustring[1]) != std::string::npos);
}